

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usrbdx_binning.cpp
# Opt level: O0

int main(int narg,char **args,char **env)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  _Setprecision _Var4;
  _Setiosflags _Var5;
  ostream *poVar6;
  undefined8 uVar7;
  istream *piVar8;
  ulong uVar9;
  void *pvVar10;
  long in_RSI;
  int in_EDI;
  int j_1;
  int i_2;
  int j;
  int i_1;
  double *values;
  int n_b;
  int n_a;
  double delta_b;
  double b_max;
  double b_min;
  double a_temp;
  double delta_a;
  double a_max;
  double a_min;
  int i;
  string nomefile;
  ifstream infile;
  char *in_stack_fffffffffffffb78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb80;
  int local_2d8;
  int local_2d4;
  int local_2d0;
  int local_2cc;
  int local_2c0;
  int local_2bc;
  double local_2b8;
  double local_2b0;
  double local_2a8;
  double local_2a0;
  double local_298;
  double local_290;
  double local_288;
  allocator local_279;
  string local_278 [36];
  int local_254;
  undefined4 local_250;
  string local_240 [32];
  istream local_220 [528];
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::ifstream::ifstream(local_220);
  std::__cxx11::string::string(local_240);
  if (local_8 == 3) {
    for (local_254 = 1; local_254 < local_8; local_254 = local_254 + 2) {
      pcVar1 = *(char **)(local_10 + (long)local_254 * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_278,pcVar1,&local_279);
      bVar3 = std::operator==(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      std::__cxx11::string::~string(local_278);
      std::allocator<char>::~allocator((allocator<char> *)&local_279);
      if (!bVar3) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Invalid argument: ");
        poVar6 = std::operator<<(poVar6,*(char **)(local_10 + (long)local_254 * 8));
        std::operator<<(poVar6,"\n");
        local_4 = -2;
        goto LAB_00102d9d;
      }
      std::__cxx11::string::operator=(local_240,*(char **)(local_10 + 8 + (long)local_254 * 8));
    }
    uVar7 = std::__cxx11::string::c_str();
    std::ifstream::open(local_220,uVar7,8);
    poVar6 = std::operator<<((ostream *)&std::cerr,"Inizio lettura file ");
    poVar6 = std::operator<<(poVar6,local_240);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    piVar8 = (istream *)std::istream::operator>>(local_220,&local_288);
    piVar8 = (istream *)std::istream::operator>>(piVar8,&local_290);
    piVar8 = (istream *)std::istream::operator>>(piVar8,&local_2bc);
    std::istream::operator>>(piVar8,&local_298);
    piVar8 = (istream *)std::istream::operator>>(local_220,&local_2a8);
    piVar8 = (istream *)std::istream::operator>>(piVar8,&local_2b0);
    piVar8 = (istream *)std::istream::operator>>(piVar8,&local_2c0);
    std::istream::operator>>(piVar8,&local_2b8);
    poVar6 = std::operator<<((ostream *)&std::cerr,"first bin: min = ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_288);
    poVar6 = std::operator<<(poVar6,", max = ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_290);
    poVar6 = std::operator<<(poVar6,", nbin = ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_2bc);
    poVar6 = std::operator<<(poVar6,", delta = ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_298);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<((ostream *)&std::cerr,"second bin: min = ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_2a8);
    poVar6 = std::operator<<(poVar6,", max = ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_2b0);
    poVar6 = std::operator<<(poVar6,", nbin = ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_2c0);
    poVar6 = std::operator<<(poVar6,", delta = ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_2b8);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    local_2a0 = local_288;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)((local_2bc + 1) * (local_2c0 + 1));
    uVar9 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    pvVar10 = operator_new__(uVar9);
    poVar6 = std::operator<<((ostream *)&std::cerr,"inizializzato vettore lettura a dimensione ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_2bc + local_2c0);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    for (local_2cc = 1; local_2cc <= local_2c0; local_2cc = local_2cc + 1) {
      for (local_2d0 = 1; local_2d0 <= local_2bc; local_2d0 = local_2d0 + 1) {
        std::istream::operator>>
                  (local_220,
                   (double *)((long)pvVar10 + (long)((local_2cc + -1) * local_2bc + local_2d0) * 8))
        ;
      }
    }
    for (local_2d4 = 1; local_2d4 <= local_2c0; local_2d4 = local_2d4 + 1) {
      for (local_2d8 = 1; local_2d8 <= local_2bc; local_2d8 = local_2d8 + 1) {
        _Var4 = std::setprecision(7);
        poVar6 = std::operator<<((ostream *)&std::cout,_Var4);
        _Var5 = std::setiosflags(_S_scientific);
        poVar6 = std::operator<<(poVar6,_Var5);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_2a0);
        poVar6 = std::operator<<(poVar6,"\t");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_2a0 + local_298);
        poVar6 = std::operator<<(poVar6,"\t");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_2a8);
        poVar6 = std::operator<<(poVar6,"\t");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_2a8 + local_2b8);
        poVar6 = std::operator<<(poVar6,"\t");
        poVar6 = (ostream *)
                 std::ostream::operator<<
                           (poVar6,*(double *)
                                    ((long)pvVar10 +
                                    (long)((local_2d4 + -1) * local_2bc + local_2d8) * 8));
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        local_2a0 = local_298 + local_2a0;
      }
      local_2a0 = local_288;
      local_2a8 = local_2b8 + local_2a8;
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"Fine lettura file ");
    poVar6 = std::operator<<(poVar6,local_240);
    poVar6 = std::operator<<(poVar6,". Riscritti ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_2bc * local_2c0);
    poVar6 = std::operator<<(poVar6," valori");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::ifstream::close();
    local_4 = 0;
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"si usa:  ./reader -f file_ascii_usrbdx.txt");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<((ostream *)&std::cout,"si puo\' redirigere l\'output con > out.txt");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    local_4 = -1;
  }
LAB_00102d9d:
  local_250 = 1;
  std::__cxx11::string::~string(local_240);
  std::ifstream::~ifstream(local_220);
  return local_4;
}

Assistant:

int main (int narg, char *args[], char *env[])
{
	ifstream infile;
	string nomefile;

	if(narg != 3)
	{
		cout << "si usa:  ./reader -f file_ascii_usrbdx.txt" << endl;
		cout << "si puo' redirigere l'output con > out.txt" << endl;
		return -1;
	}

	for (int i = 1; i < narg; i++)	// * We will iterate over args[] to get the parameters stored inside.
	{								// * Note that we're starting on 1 because we don't need to know the
									// * path of the program, which is stored in args[0]
		if (string(args[i]) == "-f")
		{
			nomefile = args[i+1];	// We know the next argument *should* be the <nome-file-da-analizzare>:
			i++;					// so that we skip in the for cycle the parsing of the <nome-file-particelle>
		}
		else
		{
			cerr << "Invalid argument: " << args[i] << "\n";
			return -2;
		}
	}

	double a_min, a_max, delta_a, a_temp, b_min, b_max, delta_b;
	int n_a, n_b;
	double * values;

	infile.open(nomefile.c_str());
	cerr << "Inizio lettura file " << nomefile << endl;

	infile >> a_min >> a_max >> n_a >> delta_a;
	infile >> b_min >> b_max >> n_b >> delta_b;

	cerr << "first bin: min = " << a_min << ", max = " << a_max << ", nbin = " << n_a << ", delta = " << delta_a << endl;
	cerr << "second bin: min = " << b_min << ", max = " << b_max << ", nbin = " << n_b << ", delta = " << delta_b << endl;

	a_temp = a_min;

	values = new double[(n_a+1)*(n_b+1)];

	cerr << "inizializzato vettore lettura a dimensione " << n_a+n_b << endl;
	for (int i = 1; i <= n_b; i++)
	{
		for (int j = 1; j <= n_a; j++)
		{
			infile >> values[(i-1)*n_a + j];
		}
	}

	//	for (int i = 1; i <= n_a*n_b; i++) cerr << values[i] << ' ';

	for (int i = 1; i <= n_b; i++)
	{
		for (int j = 1; j <= n_a; j++)
		{
			cout << setprecision(7) << setiosflags(ios::scientific) << a_temp << "\t" 
				<< a_temp+delta_a << "\t" << b_min << "\t" << b_min+delta_b << "\t" << values[(i-1)*n_a + j] << endl;
			a_temp += delta_a;
		}
		a_temp = a_min;
		b_min += delta_b;
	}

	cerr << "Fine lettura file " << nomefile << ". Riscritti " << n_a*n_b << " valori" << endl;
	infile.close();
	return 0;
}